

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlChar * xmlSchemaFormatQName(xmlChar **buf,xmlChar *namespaceName,xmlChar *localName)

{
  xmlChar *pxVar1;
  char *add;
  
  if (*buf != (xmlChar *)0x0) {
    (*xmlFree)(*buf);
    *buf = (xmlChar *)0x0;
  }
  if (namespaceName != (xmlChar *)0x0) {
    pxVar1 = xmlStrdup((xmlChar *)"{");
    *buf = pxVar1;
    pxVar1 = xmlStrcat(pxVar1,namespaceName);
    *buf = pxVar1;
    pxVar1 = xmlStrcat(pxVar1,"}");
    *buf = pxVar1;
  }
  if (localName == (xmlChar *)0x0 || namespaceName != (xmlChar *)0x0) {
    add = "(NULL)";
    if (localName != (xmlChar *)0x0) {
      add = (char *)localName;
    }
    localName = xmlStrcat(*buf,(xmlChar *)add);
    *buf = localName;
  }
  return localName;
}

Assistant:

static const xmlChar*
xmlSchemaFormatQName(xmlChar **buf,
		     const xmlChar *namespaceName,
		     const xmlChar *localName)
{
    FREE_AND_NULL(*buf)
    if (namespaceName != NULL) {
	*buf = xmlStrdup(BAD_CAST "{");
	*buf = xmlStrcat(*buf, namespaceName);
	*buf = xmlStrcat(*buf, BAD_CAST "}");
    }
    if (localName != NULL) {
	if (namespaceName == NULL)
	    return(localName);
	*buf = xmlStrcat(*buf, localName);
    } else {
	*buf = xmlStrcat(*buf, BAD_CAST "(NULL)");
    }
    return ((const xmlChar *) *buf);
}